

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void DestroyMinimumPhaseAnalysis(MinimumPhaseAnalysis *minimum_phase)

{
  fft_plan p;
  fft_plan p_00;
  long lVar1;
  long lVar2;
  double *unaff_RBX;
  fft_plan *pfVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 uStackY_58;
  undefined1 in_stack_ffffffffffffffb0 [64];
  
  bVar5 = 0;
  lVar2 = 9;
  pfVar3 = &minimum_phase->forward_fft;
  puVar4 = &uStackY_58;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar4 = *(undefined8 *)pfVar3;
    pfVar3 = (fft_plan *)&pfVar3->flags;
    puVar4 = puVar4 + 1;
  }
  p.w = unaff_RBX;
  p.n = in_stack_ffffffffffffffb0._0_4_;
  p.sign = in_stack_ffffffffffffffb0._4_4_;
  p.flags = in_stack_ffffffffffffffb0._8_4_;
  p._12_4_ = in_stack_ffffffffffffffb0._12_4_;
  p.c_in = (fft_complex *)in_stack_ffffffffffffffb0._16_8_;
  p.in = (double *)in_stack_ffffffffffffffb0._24_8_;
  p.c_out = (fft_complex *)in_stack_ffffffffffffffb0._32_8_;
  p.out = (double *)in_stack_ffffffffffffffb0._40_8_;
  p.input = (double *)in_stack_ffffffffffffffb0._48_8_;
  p.ip = (int *)in_stack_ffffffffffffffb0._56_8_;
  fft_destroy_plan(p);
  pfVar3 = &minimum_phase->inverse_fft;
  puVar4 = &uStackY_58;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pfVar3;
    pfVar3 = (fft_plan *)((long)pfVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  p_00.w = unaff_RBX;
  p_00.n = in_stack_ffffffffffffffb0._0_4_;
  p_00.sign = in_stack_ffffffffffffffb0._4_4_;
  p_00.flags = in_stack_ffffffffffffffb0._8_4_;
  p_00._12_4_ = in_stack_ffffffffffffffb0._12_4_;
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffffb0._16_8_;
  p_00.in = (double *)in_stack_ffffffffffffffb0._24_8_;
  p_00.c_out = (fft_complex *)in_stack_ffffffffffffffb0._32_8_;
  p_00.out = (double *)in_stack_ffffffffffffffb0._40_8_;
  p_00.input = (double *)in_stack_ffffffffffffffb0._48_8_;
  p_00.ip = (int *)in_stack_ffffffffffffffb0._56_8_;
  fft_destroy_plan(p_00);
  if (minimum_phase->cepstrum != (fft_complex *)0x0) {
    operator_delete__(minimum_phase->cepstrum);
  }
  if (minimum_phase->log_spectrum != (double *)0x0) {
    operator_delete__(minimum_phase->log_spectrum);
  }
  if (minimum_phase->minimum_phase_spectrum != (fft_complex *)0x0) {
    operator_delete__(minimum_phase->minimum_phase_spectrum);
    return;
  }
  return;
}

Assistant:

void DestroyMinimumPhaseAnalysis(MinimumPhaseAnalysis *minimum_phase) {
  fft_destroy_plan(minimum_phase->forward_fft);
  fft_destroy_plan(minimum_phase->inverse_fft);
  delete[] minimum_phase->cepstrum;
  delete[] minimum_phase->log_spectrum;
  delete[] minimum_phase->minimum_phase_spectrum;
}